

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.hh
# Opt level: O2

bool __thiscall JSON::JSONArray::operator<(JSONArray *this,JSONArray *a)

{
  bool bVar1;
  JSONValue *v;
  JSONValue *pJVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int local_3c;
  long local_38;
  
  bVar1 = true;
  if (a->n_elements <= this->n_elements) {
    if (this->n_elements <= a->n_elements) {
      lVar5 = 0;
      lVar4 = 0;
      do {
        lVar3 = lVar4;
        local_3c = (int)lVar3;
        local_38 = (long)this->n_elements;
        lVar4 = lVar3;
        if (local_38 <= lVar3) goto LAB_0010ab51;
        pJVar2 = this->elements;
        v = operator[](a,&local_3c);
        bVar1 = JSONValue::operator<((JSONValue *)((long)&pJVar2->data + lVar5),v);
        if (bVar1) {
          lVar4 = 1;
          goto LAB_0010ab51;
        }
        pJVar2 = operator[](a,&local_3c);
        bVar1 = JSONValue::operator<(pJVar2,(JSONValue *)((long)&this->elements->data + lVar5));
        lVar5 = lVar5 + 0x10;
        lVar4 = lVar3 + 1;
      } while (!bVar1);
      lVar4 = 0;
LAB_0010ab51:
      return (bool)(lVar3 < local_38 & (byte)lVar4);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

int length() const {return n_elements;}